

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O3

Var __thiscall
Js::TypedArray<unsigned_int,_false,_true>::BaseTypedDirectGetItemNoDetachCheck
          (TypedArray<unsigned_int,_false,_true> *this,uint32 index)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  uint64 uVar6;
  uint64 uVar7;
  Var pvVar8;
  double value;
  
  if (((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x142,"(!IsDetachedBuffer())","!IsDetachedBuffer()");
    if (!bVar3) goto LAB_00d7981f;
    *puVar5 = 0;
  }
  if ((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x143,"(index < GetLength())","index < GetLength()");
    if (!bVar3) goto LAB_00d7981f;
    *puVar5 = 0;
  }
  uVar1 = (this->super_TypedArrayBase).byteOffset;
  uVar4 = (*(((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->
            super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
  if ((ulong)uVar4 < (ulong)uVar1 + (ulong)(index + 1) * 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x144,
                                "((index + 1)* sizeof(TypeName) + GetByteOffset() <= GetArrayBuffer()->GetByteLength())"
                                ,
                                "(index + 1)* sizeof(TypeName) + GetByteOffset() <= GetArrayBuffer()->GetByteLength()"
                               );
    if (!bVar3) goto LAB_00d7981f;
    *puVar5 = 0;
  }
  uVar1 = *(uint *)((this->super_TypedArrayBase).buffer + (ulong)index * 4);
  if ((long)(int)uVar1 < 0) {
    value = (double)uVar1;
    uVar6 = NumberUtilities::ToSpecial(value);
    bVar3 = NumberUtilities::IsNan(value);
    if (bVar3) {
      uVar7 = NumberUtilities::ToSpecial(value);
      if (uVar7 != 0xfff8000000000000) {
        uVar7 = NumberUtilities::ToSpecial(value);
        if (uVar7 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar3) {
LAB_00d7981f:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
      }
    }
    pvVar8 = (Var)(uVar6 ^ 0xfffc000000000000);
  }
  else {
    pvVar8 = (Var)((long)(int)uVar1 | 0x1000000000000);
  }
  return pvVar8;
}

Assistant:

inline Var BaseTypedDirectGetItemNoDetachCheck(__in uint32 index)
        {
            Assert(!IsDetachedBuffer());
            Assert(index < GetLength());
            Assert((index + 1)* sizeof(TypeName) + GetByteOffset() <= GetArrayBuffer()->GetByteLength());
            TypeName* typedBuffer = (TypeName*)buffer;
            return JavascriptNumber::ToVar(typedBuffer[index], GetScriptContext());
        }